

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint32_t helper_mvst(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2)

{
  uint64_t uVar1;
  uint8_t byte;
  int mmu_idx_00;
  int size;
  uint64_t vaddr;
  uint64_t vaddr_00;
  uint64_t uVar2;
  uintptr_t unaff_retaddr;
  undefined1 local_f0 [7];
  uint8_t v;
  S390Access local_c8;
  int local_9c;
  uintptr_t uStack_98;
  int i;
  uintptr_t ra;
  S390Access desta;
  S390Access srca;
  int len;
  uint8_t c;
  uint64_t s;
  uint64_t d;
  int mmu_idx;
  uint32_t r2_local;
  uint32_t r1_local;
  CPUS390XState_conflict *env_local;
  
  mmu_idx_00 = cpu_mmu_index(env,false);
  vaddr = get_address(env,r1);
  vaddr_00 = get_address(env,r2);
  uVar1 = env->regs[0];
  uVar2 = vaddr_00;
  if (-(vaddr | 0xfffffffffffff000) < -(vaddr_00 | 0xfffffffffffff000)) {
    uVar2 = vaddr;
  }
  size = -((uint)uVar2 | 0xfffff000);
  if ((env->regs[0] & 0xffffff00) == 0) {
    uStack_98 = unaff_retaddr;
    access_prepare(&local_c8,env,vaddr_00,size,MMU_DATA_LOAD,mmu_idx_00,unaff_retaddr);
    memcpy(&desta.size1,&local_c8,0x28);
    access_prepare((S390Access *)local_f0,env,vaddr,size,MMU_DATA_STORE,mmu_idx_00,uStack_98);
    memcpy(&ra,local_f0,0x28);
    local_9c = 0;
    while( true ) {
      if (size <= local_9c) {
        set_address_zero(env,r1,vaddr + (long)size);
        set_address_zero(env,r2,vaddr_00 + (long)size);
        return 3;
      }
      byte = access_get_byte(env,(S390Access *)&desta.size1,local_9c,uStack_98);
      access_set_byte(env,(S390Access *)&ra,local_9c,byte,uStack_98);
      if (byte == (uint8_t)uVar1) break;
      local_9c = local_9c + 1;
    }
    set_address_zero(env,r1,vaddr + (long)local_9c);
    return 1;
  }
  tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
}

Assistant:

uint32_t HELPER(mvst)(CPUS390XState *env, uint32_t r1, uint32_t r2)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    const uint64_t d = get_address(env, r1);
    const uint64_t s = get_address(env, r2);
    const uint8_t c = env->regs[0];
    const int len = MIN(-(d | TARGET_PAGE_MASK), -(s | TARGET_PAGE_MASK));
    S390Access srca, desta;
    uintptr_t ra = GETPC();
    int i;

    if (env->regs[0] & 0xffffff00ull) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    /*
     * Our access should not exceed single pages, as we must not report access
     * exceptions exceeding the actually copied range (which we don't know at
     * this point). We might over-indicate watchpoints within the pages
     * (if we ever care, we have to limit processing to a single byte).
     */
    srca = access_prepare(env, s, len, MMU_DATA_LOAD, mmu_idx, ra);
    desta = access_prepare(env, d, len, MMU_DATA_STORE, mmu_idx, ra);
    for (i = 0; i < len; i++) {
        const uint8_t v = access_get_byte(env, &srca, i, ra);

        access_set_byte(env, &desta, i, v, ra);
        if (v == c) {
            set_address_zero(env, r1, d + i);
            return 1;
        }
    }
    set_address_zero(env, r1, d + len);
    set_address_zero(env, r2, s + len);
    return 3;
}